

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateEnumValueDocComment
               (Printer *printer,EnumValueDescriptor *value)

{
  Printer *in_RSI;
  EnumValueDescriptor *in_stack_ffffffffffffff88;
  string local_70 [8];
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa8;
  string local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  Printer *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  Printer *in_stack_ffffffffffffffd0;
  EnumValueDescriptor *in_stack_ffffffffffffffe8;
  
  io::Printer::Print<>(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  GenerateDocCommentBody<google::protobuf::EnumValueDescriptor>(in_RSI,in_stack_ffffffffffffffe8);
  EnumValueDescriptor::DebugString_abi_cxx11_(in_stack_ffffffffffffff88);
  FirstLineOf(in_stack_ffffffffffffff98);
  EscapePhpdoc(in_stack_ffffffffffffffa8);
  io::Printer::Print<char[4],std::__cxx11::string>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             &in_stack_ffffffffffffffc0->variable_delimiter_,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void GenerateEnumValueDocComment(io::Printer* printer,
                                 const EnumValueDescriptor* value) {
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, value);
  printer->Print(
    " * Generated from protobuf enum <code>^def^</code>\n"
    " */\n",
    "def", EscapePhpdoc(FirstLineOf(value->DebugString())));
}